

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O2

void nni_http_prune_body(nng_http *conn)

{
  nni_http_entity *entity;
  
  entity = &(conn->res).data;
  if (conn->client != false) {
    entity = &(conn->req).data;
  }
  http_set_data(entity,(void *)0x0,0);
  return;
}

Assistant:

void
nni_http_prune_body(nng_http *conn)
{
	// prune body but leave content-length header intact.
	// This is for HEAD.
	if (conn->client) {
		http_set_data(&conn->req.data, NULL, 0);
	} else {
		http_set_data(&conn->res.data, NULL, 0);
	}
}